

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-test.cc
# Opt level: O2

void __thiscall TimeTest_GrowBuffer_Test::TestBody(TimeTest_GrowBuffer_Test *this)

{
  tm *format_str;
  tm *in_RCX;
  int iVar1;
  bool bVar2;
  time_t t;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&s,"{:",(allocator *)&t);
  iVar1 = 0x1e;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    std::__cxx11::string::append((char *)&s);
  }
  std::__cxx11::string::append((char *)&s);
  t = time((time_t *)0x0);
  format_str = localtime(&t);
  fmt::v5::format<std::__cxx11::string,tm>
            (&local_38,(v5 *)&s,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)format_str,in_RCX)
  ;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

TEST(TimeTest, GrowBuffer) {
  std::string s = "{:";
  for (int i = 0; i < 30; ++i)
    s += "%c";
  s += "}\n";
  std::time_t t = std::time(FMT_NULL);
  fmt::format(s, *std::localtime(&t));
}